

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForField
          (Generator *this,GeneratorOptions *options,FieldDescriptor *field,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  FieldDescriptor *pFVar2;
  bool bVar3;
  CppType CVar4;
  Descriptor *pDVar5;
  GeneratorOptions *pGVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  string local_90;
  _Base_ptr local_70;
  undefined1 local_68;
  string local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *forwards_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *required_local;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_30 = forwards;
  forwards_local = required;
  required_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)field;
  field_local = (FieldDescriptor *)options;
  options_local = (GeneratorOptions *)this;
  CVar4 = FieldDescriptor::cpp_type(field);
  if ((CVar4 != CPPTYPE_ENUM) ||
     ((bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)required_local), bVar3 &&
      (pDVar5 = FieldDescriptor::extension_scope((FieldDescriptor *)required_local),
      pDVar5 == (Descriptor *)0x0)))) {
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)required_local);
    pFVar2 = field_local;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)required_local);
      bVar3 = anon_unknown_0::IgnoreMessage((GeneratorOptions *)pFVar2,pDVar5);
      pFVar2 = field_local;
      psVar1 = forwards_local;
      if (!bVar3) {
        pGVar6 = (GeneratorOptions *)
                 FieldDescriptor::message_type((FieldDescriptor *)required_local);
        (anonymous_namespace)::GetMessagePath_abi_cxx11_
                  (&local_c0,(_anonymous_namespace_ *)pFVar2,pGVar6,(Descriptor *)required);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(psVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  }
  else {
    pFVar2 = field_local;
    this_00 = forwards_local;
    psVar1 = local_30;
    if (((byte)field_local[0x48] & 1) == 0) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::enum_type((FieldDescriptor *)required_local);
      (anonymous_namespace)::GetEnumPath_abi_cxx11_
                (&local_90,(_anonymous_namespace_ *)pFVar2,pGVar6,(EnumDescriptor *)required);
      pVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(psVar1,&local_90);
      local_a0 = (_Base_ptr)pVar7.first._M_node;
      local_98 = pVar7.second;
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::enum_type((FieldDescriptor *)required_local);
      (anonymous_namespace)::GetEnumPath_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)pFVar2,pGVar6,(EnumDescriptor *)required);
      pVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this_00,&local_50);
      local_70 = (_Base_ptr)pVar7.first._M_node;
      local_68 = pVar7.second;
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void Generator::FindRequiresForField(const GeneratorOptions& options,
                                     const FieldDescriptor* field,
                                     std::set<string>* required,
                                     std::set<string>* forwards) const {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
        // N.B.: file-level extensions with enum type do *not* create
        // dependencies, as per original codegen.
        !(field->is_extension() && field->extension_scope() == NULL)) {
      if (options.add_require_for_enums) {
        required->insert(GetEnumPath(options, field->enum_type()));
      } else {
        forwards->insert(GetEnumPath(options, field->enum_type()));
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!IgnoreMessage(options, field->message_type())) {
        required->insert(GetMessagePath(options, field->message_type()));
      }
    }
}